

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O3

bool __thiscall
ON_Curve::IsContinuous
          (ON_Curve *this,continuity desired_continuity,double t,int *hint,double point_tolerance,
          double d1_tolerance,double d2_tolerance,double cos_angle_tolerance,
          double curvature_tolerance)

{
  double dVar1;
  ON_3dVector Km;
  ON_3dVector Km_00;
  ON_3dVector Kp;
  ON_3dVector Kp_00;
  bool bVar2;
  bool bVar3;
  int iVar4;
  continuity cVar5;
  double *pdVar6;
  ON_3dVector *__return_storage_ptr__;
  undefined4 uVar7;
  undefined4 uVar8;
  ON_3dPoint Pm;
  ON_3dPoint Pp;
  ON_3dVector D2m;
  ON_3dVector D1m;
  ON_3dVector D2p;
  ON_3dVector D1p;
  ON_Interval domain;
  double local_148;
  double local_140;
  ON_3dPoint local_138;
  double local_120;
  ON_3dPoint local_118;
  double local_100;
  double local_f8;
  double local_f0;
  ON_3dVector local_e8;
  ON_3dVector local_d0;
  ON_3dVector local_b8;
  ON_3dVector local_a0;
  ON_Interval local_88;
  double local_78;
  ON_3dVector local_70;
  ON_3dVector local_58;
  ON_3dVector local_40;
  
  local_120 = point_tolerance;
  local_100 = curvature_tolerance;
  local_f8 = d1_tolerance;
  local_f0 = cos_angle_tolerance;
  local_78 = d2_tolerance;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  local_88.m_t[1] = point_tolerance;
  bVar2 = ON_Interval::IsIncreasing(&local_88);
  if (!bVar2) {
    return true;
  }
  pdVar6 = ON_Interval::operator[](&local_88,0);
  if (desired_continuity - C0_locus_continuous < 5) {
    if (t <= *pdVar6) {
      return true;
    }
    pdVar6 = ON_Interval::operator[](&local_88,1);
    if ((*pdVar6 != t) || (NAN(*pdVar6) || NAN(t))) goto LAB_00424f81;
    iVar4 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x34])(this);
    if ((char)iVar4 == '\0') {
      return false;
    }
    if (desired_continuity == C0_locus_continuous) {
      return true;
    }
    pdVar6 = ON_Interval::operator[](&local_88,0);
    local_148 = *pdVar6;
    pdVar6 = ON_Interval::operator[](&local_88,1);
    local_140 = *pdVar6;
    bVar2 = true;
  }
  else {
    if (t <= *pdVar6) {
      return true;
    }
    pdVar6 = ON_Interval::operator[](&local_88,1);
    if (*pdVar6 <= t) {
      return true;
    }
LAB_00424f81:
    bVar2 = false;
    local_148 = t;
    local_140 = t;
  }
  cVar5 = ON::ParametricContinuity(desired_continuity);
  switch(cVar5) {
  case C0_continuous:
    bVar3 = EvPoint(this,local_140,&local_138,-1,hint);
    if (!bVar3) {
      return false;
    }
    bVar3 = EvPoint(this,local_148,&local_118,1,hint);
    if (!bVar3) {
      return false;
    }
    if (bVar2) {
      local_138.z = local_118.z;
      local_138.x = local_118.x;
      local_138.y = local_118.y;
    }
    __return_storage_ptr__ = &local_d0;
    ON_3dPoint::operator-(__return_storage_ptr__,&local_138,&local_118);
    uVar7 = SUB84(local_120,0);
    uVar8 = (undefined4)((ulong)local_120 >> 0x20);
    break;
  case C1_continuous:
    bVar3 = Ev1Der(this,local_140,&local_138,&local_d0,-1,hint);
    if (!bVar3) {
      return false;
    }
    bVar3 = Ev1Der(this,local_148,&local_118,&local_a0,1,hint);
    if (!bVar3) {
      return false;
    }
    if (bVar2) {
      local_138.z = local_118.z;
      local_138.x = local_118.x;
      local_138.y = local_118.y;
    }
    ON_3dPoint::operator-(&local_e8,&local_138,&local_118);
    bVar2 = ON_3dVector::IsTiny(&local_e8,local_120);
    if (!bVar2) {
      return false;
    }
    __return_storage_ptr__ = &local_b8;
    ON_3dVector::operator-(__return_storage_ptr__,&local_d0,&local_a0);
    uVar7 = SUB84(local_f8,0);
    uVar8 = (undefined4)((ulong)local_f8 >> 0x20);
    break;
  case C2_continuous:
    bVar3 = Ev2Der(this,local_140,&local_138,&local_d0,&local_e8,-1,hint);
    if (!bVar3) {
      return false;
    }
    bVar3 = Ev2Der(this,local_148,&local_118,&local_a0,&local_b8,1,hint);
    if (!bVar3) {
      return false;
    }
    if (bVar2) {
      local_138.z = local_118.z;
      local_138.x = local_118.x;
      local_138.y = local_118.y;
    }
    ON_3dPoint::operator-(&local_70,&local_138,&local_118);
    bVar2 = ON_3dVector::IsTiny(&local_70,local_120);
    if (!bVar2) {
      return false;
    }
    ON_3dVector::operator-(&local_40,&local_d0,&local_a0);
    bVar2 = ON_3dVector::IsTiny(&local_40,local_f8);
    if (!bVar2) {
      return false;
    }
    __return_storage_ptr__ = &local_58;
    ON_3dVector::operator-(__return_storage_ptr__,&local_e8,&local_b8);
    uVar7 = SUB84(local_78,0);
    uVar8 = (undefined4)((ulong)local_78 >> 0x20);
    break;
  case G1_continuous:
    bVar3 = EvTangent(this,local_140,&local_138,&local_d0,-1,hint);
    if (!bVar3) {
      return false;
    }
    bVar3 = EvTangent(this,local_148,&local_118,&local_a0,1,hint);
    if (!bVar3) {
      return false;
    }
    if (bVar2) {
      local_138.z = local_118.z;
      local_138.x = local_118.x;
      local_138.y = local_118.y;
    }
    ON_3dPoint::operator-(&local_e8,&local_138,&local_118);
    bVar2 = ON_3dVector::IsTiny(&local_e8,local_120);
    if (!bVar2) {
      return false;
    }
    dVar1 = ON_3dVector::operator*(&local_d0,&local_a0);
    if (dVar1 < local_f0) {
      return false;
    }
    return true;
  case G2_continuous:
  case Gsmooth_continuous:
    bVar3 = EvCurvature(this,local_140,&local_138,&local_d0,&local_e8,-1,hint);
    if (!bVar3) {
      return false;
    }
    bVar3 = EvCurvature(this,local_148,&local_118,&local_a0,&local_b8,1,hint);
    if (!bVar3) {
      return false;
    }
    if (!bVar2) {
      ON_3dPoint::operator-(&local_70,&local_138,&local_118);
      bVar2 = ON_3dVector::IsTiny(&local_70,local_120);
      if (!bVar2) {
        return false;
      }
    }
    dVar1 = ON_3dVector::operator*(&local_d0,&local_a0);
    if (dVar1 < local_f0) {
      return false;
    }
    if (cVar5 == Gsmooth_continuous) {
      Km.y = local_e8.y;
      Km.x = local_e8.x;
      Km.z = local_e8.z;
      Kp.y = local_b8.y;
      Kp.x = local_b8.x;
      Kp.z = local_b8.z;
      bVar2 = ON_IsGsmoothCurvatureContinuous(Km,Kp,local_f0,local_100);
    }
    else {
      Km_00.y = local_e8.y;
      Km_00.x = local_e8.x;
      Km_00.z = local_e8.z;
      Kp_00.y = local_b8.y;
      Kp_00.x = local_b8.x;
      Kp_00.z = local_b8.z;
      bVar2 = ON_IsG2CurvatureContinuous(Km_00,Kp_00,local_f0,local_100);
    }
    goto LAB_0042533f;
  default:
    goto LAB_00425412;
  }
  bVar2 = ON_3dVector::IsTiny(__return_storage_ptr__,(double)CONCAT44(uVar8,uVar7));
LAB_0042533f:
  if (bVar2 == false) {
    return false;
  }
LAB_00425412:
  return true;
}

Assistant:

bool ON_Curve::IsContinuous(
    ON::continuity desired_continuity,
    double t, 
    int* hint, // default = nullptr,
    double point_tolerance, // default=ON_ZERO_TOLERANCE
    double d1_tolerance, // default==ON_ZERO_TOLERANCE
    double d2_tolerance, // default==ON_ZERO_TOLERANCE
    double cos_angle_tolerance, // default==ON_DEFAULT_ANGLE_TOLERANCE_COSINE
    double curvature_tolerance  // default==ON_SQRT_EPSILON
    ) const
{
  ON_Interval domain = Domain();
  if ( !domain.IsIncreasing() )
  {
    return true;
  }

  ON_3dPoint Pm, Pp;
  ON_3dVector D1m, D1p, D2m, D2p, Tm, Tp, Km, Kp;

  bool bIsClosed = false;

  // 20 March 2003 Dale Lear
  //     I added this preable to handle the new
  //     locus continuity values.
  double t0 = t;
  double t1 = t;
  switch(desired_continuity)
  {
  case ON::continuity::C0_locus_continuous:
  case ON::continuity::C1_locus_continuous:
  case ON::continuity::C2_locus_continuous:
  case ON::continuity::G1_locus_continuous:
  case ON::continuity::G2_locus_continuous:
    if ( t <= domain[0] )
    {
      // By convention - see comments by ON::continuity enum.
      return true;
    }
    if ( t == domain[1] )
    {
      if ( !IsClosed() )
      {
        // open curves are not locus continuous at the end parameter
        // see comments by ON::continuity enum
        return false;
      }
      else 
      {
        if ( ON::continuity::C0_locus_continuous == desired_continuity )
        {
          return true;
        }
        bIsClosed = true;
      }

      t0 = domain[0];
      t1 = domain[1];
    }
    break;

  case ON::continuity::unknown_continuity:
  case ON::continuity::C0_continuous:
  case ON::continuity::C1_continuous:
  case ON::continuity::C2_continuous:
  case ON::continuity::G1_continuous:
  case ON::continuity::G2_continuous:
  case ON::continuity::Cinfinity_continuous:
  case ON::continuity::Gsmooth_continuous:
  default:
    // does not change pre 20 March behavior - just skips the out
    // of domain evaluation on parametric queries.
    if ( t <= domain[0] || t >= domain[1] )
      return true;
    break;
  }

  // at this point, no difference between parametric and locus tests.
  desired_continuity = ON::ParametricContinuity((int)desired_continuity);


  // this is slow and uses evaluation
  // virtual overrides on curve classes that can have multiple spans
  // are much faster because the avoid evaluation
  switch ( desired_continuity )
  {
  case ON::continuity::unknown_continuity:
    break;

  case ON::continuity::C0_continuous:  
    if ( !EvPoint( t1, Pm, -1, hint ) )
      return false;
    if ( !EvPoint( t0, Pp,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) )
      return false;
    break;

  case ON::continuity::C1_continuous:
    if ( !Ev1Der( t1, Pm, D1m, -1, hint ) )
      return false;
    if ( !Ev1Der( t0, Pp, D1p,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || !(D1m-D1p).IsTiny(d1_tolerance) )
      return false;
    break;

  case ON::continuity::G1_continuous:
    if ( !EvTangent( t1, Pm, Tm, -1, hint ) )
      return false;
    if ( !EvTangent( t0, Pp, Tp,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || Tm*Tp < cos_angle_tolerance )
      return false;
    break;

  case ON::continuity::C2_continuous:
    if ( !Ev2Der( t1, Pm, D1m, D2m, -1, hint ) )
      return false;
    if ( !Ev2Der( t0, Pp, D1p, D2p,  1, hint ) )
      return false;
    if ( bIsClosed )
      Pm = Pp;
    if ( !(Pm-Pp).IsTiny(point_tolerance) || !(D1m-D1p).IsTiny(d1_tolerance) || !(D2m-D2p).IsTiny(d2_tolerance) )
      return false;
    break;

  case ON::continuity::G2_continuous:
  case ON::continuity::Gsmooth_continuous:
    if ( !EvCurvature( t1, Pm, Tm, Km, -1, hint ) )
      return false;
    if ( !EvCurvature( t0, Pp, Tp, Kp,  1, hint ) )
      return false;
    if ( !bIsClosed && !(Pm-Pp).IsTiny(point_tolerance) )
      return false;
    if ( Tm*Tp < cos_angle_tolerance )
      return false; // tangent discontinuity

    if ( desired_continuity == ON::continuity::Gsmooth_continuous )
    {
      if ( !ON_IsGsmoothCurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance) )
        return false;
    }
    else
    {
      if ( !ON_IsG2CurvatureContinuous(Km,Kp,cos_angle_tolerance,curvature_tolerance) )
        return false;
    }
    break;

  case ON::continuity::C0_locus_continuous:
  case ON::continuity::C1_locus_continuous:
  case ON::continuity::C2_locus_continuous:
  case ON::continuity::G1_locus_continuous:
  case ON::continuity::G2_locus_continuous:
  case ON::continuity::Cinfinity_continuous:
    break;
  }

  return true;
}